

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadgamma.hpp
# Opt level: O0

vector<TensorEntry,_std::allocator<TensorEntry>_> *
symmetric_fold(vector<TensorEntry,_std::allocator<TensorEntry>_> *__return_storage_ptr__,
              vector<TensorEntry,_std::allocator<TensorEntry>_> *v)

{
  bool bVar1;
  reference pTVar2;
  value_type local_68 [2];
  value_type local_50;
  undefined8 local_44;
  TensorEntry e;
  iterator __end1;
  iterator __begin1;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *__range1;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *v_local;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *res;
  
  std::vector<TensorEntry,_std::allocator<TensorEntry>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::begin(v);
  e._4_8_ = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::end(v);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<TensorEntry_*,_std::vector<TensorEntry,_std::allocator<TensorEntry>_>_>
                                     *)&e.c), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<TensorEntry_*,_std::vector<TensorEntry,_std::allocator<TensorEntry>_>_>
             ::operator*(&__end1);
    local_44._0_2_ = pTVar2->a;
    local_44._2_2_ = pTVar2->b;
    local_44._4_2_ = pTVar2->c;
    local_44._6_2_ = *(undefined2 *)&pTVar2->field_0x6;
    e._0_4_ = pTVar2->val;
    if ((short)local_44 < local_44._2_2_) {
      local_50.a = (short)local_44;
      local_50.b = local_44._2_2_;
      local_50.c = local_44._4_2_;
      local_50.val = (float)e._0_4_ + (float)e._0_4_;
      std::vector<TensorEntry,_std::allocator<TensorEntry>_>::push_back
                (__return_storage_ptr__,&local_50);
    }
    if ((short)local_44 == local_44._2_2_) {
      local_68[0].a = (short)local_44;
      local_68[0].b = local_44._2_2_;
      local_68[0].c = local_44._4_2_;
      local_68[0].val = (float)e._0_4_;
      std::vector<TensorEntry,_std::allocator<TensorEntry>_>::push_back
                (__return_storage_ptr__,local_68);
    }
    __gnu_cxx::
    __normal_iterator<TensorEntry_*,_std::vector<TensorEntry,_std::allocator<TensorEntry>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TensorEntry> symmetric_fold(std::vector<TensorEntry> v)
{
	std::vector<TensorEntry> res;
	for (auto e: v) {
		if (e.a < e.b)
			res.push_back({e.a, e.b, e.c, e.val*2});
		if (e.a == e.b)
			res.push_back({e.a, e.b, e.c, e.val});
	}
	return res;
}